

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O0

MatchData * __thiscall
IntrusiveList<MatchData>::operator[](IntrusiveList<MatchData> *this,uint index)

{
  MatchData *local_20;
  MatchData *curr;
  uint index_local;
  IntrusiveList<MatchData> *this_local;
  
  local_20 = this->head;
  for (curr._4_4_ = index; curr._4_4_ != 0 && local_20 != (MatchData *)0x0;
      curr._4_4_ = curr._4_4_ - 1) {
    local_20 = local_20->next;
  }
  if (curr._4_4_ == 0) {
    return local_20;
  }
  __assert_fail("index == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/IntrusiveList.h"
                ,0x3f,"T *IntrusiveList<MatchData>::operator[](unsigned int) const [T = MatchData]")
  ;
}

Assistant:

T* operator[](unsigned index) const
	{
		T *curr = head;

		while(index && curr)
		{
			curr = curr->next;
			index--;
		}

		assert(index == 0);

		return curr;
	}